

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O3

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::ExpressionListRef::Deserialize(ExpressionListRef *this,Deserializer *deserializer)

{
  uint uVar1;
  pointer pEVar2;
  __uniq_ptr_impl<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>_>
  local_70;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
  local_68;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
  local_48;
  
  local_70._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
  .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl =
       (tuple<duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>)
       operator_new(0xb0);
  *(undefined1 *)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 8) = 6;
  *(_func_int ***)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x10) =
       (_func_int **)
       ((long)local_70._M_t.
              super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
              .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x20);
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x18) =
       (_func_int *)0x0;
  *(undefined1 *)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x20) = 0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x30) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x38) =
       (_func_int *)0xffffffffffffffff;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x40) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x48) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x50) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x58) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x60) =
       (_func_int *)0x0;
  *(undefined ***)
   local_70._M_t.
   super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
   .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl =
       &PTR__ExpressionListRef_01982388;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x68) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x70) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x78) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x80) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x88) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x90) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0x98) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0xa0) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
          .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl + 0xa8) =
       (_func_int *)0x0;
  pEVar2 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
           ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                         *)&local_70);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,200,"expected_names",&pEVar2->expected_names);
  pEVar2 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
           ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                         *)&local_70);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0xc9,"expected_types",&pEVar2->expected_types);
  pEVar2 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
           ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                         *)&local_70);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"values");
  if ((char)uVar1 == '\0') {
    local_48.
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pEVar2->values).
         super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
         .
         super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pEVar2->values).
         super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
         .
         super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pEVar2->values).
         super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
         .
         super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pEVar2->values).
    super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    .
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pEVar2->values).
    super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    .
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pEVar2->values).
    super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    .
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ::~vector(&local_48);
  }
  else {
    Deserializer::
    Read<duckdb::vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,true>>
              ((type *)&local_68,deserializer);
    local_48.
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pEVar2->values).
         super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
         .
         super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pEVar2->values).
    super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    .
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pEVar2->values).
         super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
         .
         super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pEVar2->values).
         super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
         .
         super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pEVar2->values).
    super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    .
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pEVar2->values).
    super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    .
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_68.
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ::~vector(&local_48);
  }
  ::std::
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
  ::~vector(&local_68);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  (this->super_TableRef)._vptr_TableRef =
       (_func_int **)
       local_70._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
       .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> ExpressionListRef::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ExpressionListRef>(new ExpressionListRef());
	deserializer.ReadPropertyWithDefault<vector<string>>(200, "expected_names", result->expected_names);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(201, "expected_types", result->expected_types);
	deserializer.ReadPropertyWithDefault<vector<vector<unique_ptr<ParsedExpression>>>>(202, "values", result->values);
	return std::move(result);
}